

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_sendquote(connectdata *conn,curl_slist *quote)

{
  char cVar1;
  curltime cVar2;
  undefined4 uStack_5c;
  char *pcStack_50;
  _Bool acceptfail;
  char *cmd;
  pingpong *pp;
  ftp_conn *ftpc;
  CURLcode result;
  int ftpcode;
  ssize_t nread;
  curl_slist *item;
  curl_slist *quote_local;
  connectdata *conn_local;
  
  nread = (ssize_t)quote;
  item = quote;
  quote_local = (curl_slist *)conn;
  do {
    if (nread == 0) {
      return CURLE_OK;
    }
    if (*(long *)nread != 0) {
      pcStack_50 = *(char **)nread;
      cVar1 = *pcStack_50;
      if (cVar1 == '*') {
        pcStack_50 = pcStack_50 + 1;
      }
      ftpc._0_4_ = Curl_pp_sendf((pingpong *)&quote_local[0x62].next,"%s",pcStack_50);
      if ((CURLcode)ftpc != CURLE_OK) {
        return (CURLcode)ftpc;
      }
      cVar2 = Curl_now();
      (conn->proto).smbc.sent = cVar2.tv_sec;
      (conn->proto).smbc.got = CONCAT44(uStack_5c,cVar2.tv_usec);
      ftpc._0_4_ = Curl_GetFTPResponse((ssize_t *)&result,(connectdata *)quote_local,
                                       (int *)((long)&ftpc + 4));
      if ((CURLcode)ftpc != CURLE_OK) {
        return (CURLcode)ftpc;
      }
      if ((cVar1 != '*') && (399 < ftpc._4_4_)) {
        Curl_failf((Curl_easy *)quote_local->data,"QUOT string not accepted: %s",pcStack_50);
        return CURLE_QUOTE_ERROR;
      }
      ftpc._0_4_ = 0;
    }
    nread = *(ssize_t *)(nread + 8);
  } while( true );
}

Assistant:

static
CURLcode ftp_sendquote(struct connectdata *conn, struct curl_slist *quote)
{
  struct curl_slist *item;
  ssize_t nread;
  int ftpcode;
  CURLcode result;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;

  item = quote;
  while(item) {
    if(item->data) {
      char *cmd = item->data;
      bool acceptfail = FALSE;

      /* if a command starts with an asterisk, which a legal FTP command never
         can, the command will be allowed to fail without it causing any
         aborts or cancels etc. It will cause libcurl to act as if the command
         is successful, whatever the server reponds. */

      if(cmd[0] == '*') {
        cmd++;
        acceptfail = TRUE;
      }

      PPSENDF(&conn->proto.ftpc.pp, "%s", cmd);

      pp->response = Curl_now(); /* timeout relative now */

      result = Curl_GetFTPResponse(&nread, conn, &ftpcode);
      if(result)
        return result;

      if(!acceptfail && (ftpcode >= 400)) {
        failf(conn->data, "QUOT string not accepted: %s", cmd);
        return CURLE_QUOTE_ERROR;
      }
    }

    item = item->next;
  }

  return CURLE_OK;
}